

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fixture_unittests.cc
# Opt level: O0

pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* UniqueObjectHelper<std::pair<std::__cxx11::string_const,std::__cxx11::string>>(int index)

{
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  int in_stack_0000000c;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffffa0;
  string local_50 [32];
  string local_30 [48];
  
  __x = in_RDI;
  UniqueObjectHelper<std::__cxx11::string>(in_stack_0000000c);
  UniqueObjectHelper<std::__cxx11::string>(in_stack_0000000c);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (in_stack_ffffffffffffffa0,&__x->first,&in_RDI->first);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  return __x;
}

Assistant:

pair<const string, string> UniqueObjectHelper(int index) {
  return pair<const string, string>(UniqueObjectHelper<string>(index),
                                    UniqueObjectHelper<string>(index + 1));
}